

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

MauResult __thiscall
mau::ProxySession::Initialize
          (ProxySession *this,char *serverHostname,uint16_t serverPort,MauProxyConfig *proxyConfig,
          MauChannelConfig *channelConfig)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  socklen_t __len;
  int iVar5;
  ostream *poVar6;
  void *pvVar7;
  basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar8;
  ProxySession *this_00;
  undefined8 *in_RCX;
  undefined2 in_DX;
  ProxySession *extraout_RDX;
  LogStringBuffer *in_RSI;
  long in_RDI;
  error_code eVar9;
  uint8_t *readBuffer;
  error_code error;
  UDPAddress bindAddress;
  ostringstream oss;
  MauResult result;
  Locker locker;
  char *operation;
  error_code error_1;
  LogStringBuffer buffer;
  undefined4 in_stack_fffffffffffff718;
  MauResult_t in_stack_fffffffffffff71c;
  LogStringBuffer *in_stack_fffffffffffff720;
  MauChannelConfig_t *in_stack_fffffffffffff728;
  LockedValue<MauChannelConfig_t> *in_stack_fffffffffffff730;
  string *in_stack_fffffffffffff738;
  undefined1 *puVar10;
  ProxySession *in_stack_fffffffffffff740;
  undefined8 in_stack_fffffffffffff748;
  uint __val;
  ProxySession **in_stack_fffffffffffff750;
  LogStringBuffer *in_stack_fffffffffffff758;
  Allocator *in_stack_fffffffffffff760;
  uint8_t *in_stack_fffffffffffff768;
  allocator *paVar11;
  DeliveryCommonData *in_stack_fffffffffffff780;
  DeliveryChannel *in_stack_fffffffffffff788;
  ProxySession *in_stack_fffffffffffff810;
  undefined1 local_6f1 [40];
  allocator local_6c9;
  ProxySession *local_6c8;
  undefined1 local_6c0 [8];
  code *local_6b8;
  WindowHeader *local_6b0;
  undefined1 local_6a8 [8];
  int local_6a0;
  socklen_t local_690;
  int local_67c;
  error_code local_678;
  int local_668;
  undefined1 local_664 [28];
  undefined1 local_648 [8];
  undefined1 local_640 [8];
  undefined1 local_638 [8];
  undefined1 local_630 [16];
  string local_620 [32];
  string local_600 [32];
  ostringstream local_5e0 [396];
  MauResult local_454 [6];
  undefined2 local_43a;
  LogStringBuffer *local_438;
  undefined1 local_411;
  element_type *local_410;
  undefined1 *local_408;
  int local_3e4;
  long local_3e0;
  undefined1 local_3c1;
  undefined1 *local_3c0;
  undefined1 local_3a1;
  element_type *local_3a0;
  undefined1 *local_398;
  undefined1 local_379;
  element_type *local_378;
  undefined1 *local_370;
  int local_368;
  error_category *local_360;
  boolean<1,_2> local_354;
  int local_350;
  error_category *local_348;
  integer<1,_8> local_33c;
  int local_338;
  error_category *local_330;
  integer<1,_7> local_324;
  char *local_320;
  error_code local_318;
  int local_308;
  int local_304;
  char *local_300;
  long local_2f8;
  char local_2ed;
  undefined1 local_2d9;
  undefined1 *local_2d8;
  code **local_2d0;
  undefined1 *local_2c8;
  MauResult *local_2c0;
  char *local_2b8;
  MauResult *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  undefined4 local_284;
  undefined1 local_268 [392];
  MauResult *local_e0;
  char *local_d8;
  undefined4 local_cc;
  MauResult *local_c0;
  char *local_b8;
  string *local_b0;
  undefined1 *local_a8;
  string *local_98;
  undefined1 *local_90;
  string *local_80;
  undefined1 *local_78;
  MauResult *local_70;
  char *local_68;
  undefined1 *local_60;
  char *local_50;
  undefined1 *local_48;
  MauResult *local_38;
  undefined1 *local_30;
  char *local_20;
  undefined1 *local_18;
  MauResult *local_10;
  undefined1 *local_8;
  
  __val = (uint)((ulong)in_stack_fffffffffffff748 >> 0x20);
  local_454[0] = Mau_Success;
  *(undefined8 *)(in_RDI + 0x2f0) = in_RCX[4];
  uVar1 = in_RCX[1];
  uVar2 = in_RCX[2];
  uVar3 = in_RCX[3];
  *(undefined8 *)(in_RDI + 0x2d0) = *in_RCX;
  *(undefined8 *)(in_RDI + 0x2d8) = uVar1;
  *(undefined8 *)(in_RDI + 0x2e0) = uVar2;
  *(undefined8 *)(in_RDI + 0x2e8) = uVar3;
  local_43a = in_DX;
  local_438 = in_RSI;
  LockedValue<MauChannelConfig_t>::Set(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x2f8),(char *)local_438);
  *(undefined2 *)(in_RDI + 0x318) = local_43a;
  std::__cxx11::ostringstream::ostringstream(local_5e0);
  poVar6 = std::operator<<((ostream *)local_5e0,"[Port ");
  std::__cxx11::to_string(__val);
  poVar6 = std::operator<<(poVar6,local_600);
  std::operator<<(poVar6,"] ");
  std::__cxx11::string::~string(local_600);
  std::__cxx11::ostringstream::str();
  logger::Channel::SetPrefix((Channel *)in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  std::__cxx11::string::~string(local_620);
  local_3c0 = local_630;
  pvVar7 = operator_new(0x10,(nothrow_t *)&std::nothrow);
  local_3c1 = 0;
  if (pvVar7 != (void *)0x0) {
    local_3c1 = 1;
    asio::io_context::io_context((io_context *)in_stack_fffffffffffff740);
  }
  std::shared_ptr<asio::io_context>::shared_ptr<asio::io_context,void>
            ((shared_ptr<asio::io_context> *)in_stack_fffffffffffff720,
             (io_context *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  std::shared_ptr<asio::io_context>::operator=
            ((shared_ptr<asio::io_context> *)in_stack_fffffffffffff720,
             (shared_ptr<asio::io_context> *)
             CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  std::shared_ptr<asio::io_context>::~shared_ptr((shared_ptr<asio::io_context> *)0x10cba1);
  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x58));
  if (!bVar4) {
    local_454[0] = Mau_OOM;
    goto LAB_0010d948;
  }
  std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x10cd24);
  asio::io_context::restart((io_context *)0x10cd2c);
  local_410 = std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffff720);
  local_408 = local_638;
  pvVar7 = operator_new(0x40,(nothrow_t *)&std::nothrow);
  local_411 = 0;
  if (pvVar7 != (void *)0x0) {
    local_411 = 1;
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
    ::basic_waitable_timer
              ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                *)in_stack_fffffffffffff720,
               (io_context *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  }
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>>>
  ::
  unique_ptr<std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>>,void>
            ((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
              *)in_stack_fffffffffffff720,
             (pointer)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::operator=((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
               *)in_stack_fffffffffffff720,
              (unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                 *)in_stack_fffffffffffff730);
  local_3a0 = std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffff720);
  local_398 = local_640;
  pvVar7 = operator_new(0x20,(nothrow_t *)&std::nothrow);
  local_3a1 = 0;
  if (pvVar7 != (void *)0x0) {
    local_3a1 = 1;
    asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::
    basic_datagram_socket
              ((basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                *)in_stack_fffffffffffff720,
               (io_context *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  }
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>,std::default_delete<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>>>
  ::
  unique_ptr<std::default_delete<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>>,void>
            ((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              *)in_stack_fffffffffffff720,
             (pointer)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::operator=((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               *)in_stack_fffffffffffff720,
              (unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                 *)in_stack_fffffffffffff730);
  local_378 = std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffff720);
  local_370 = local_648;
  pvVar7 = operator_new(0x18,(nothrow_t *)&std::nothrow);
  local_379 = 0;
  if (pvVar7 != (void *)0x0) {
    local_379 = 1;
    asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>::
    basic_resolver((basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_> *)
                   in_stack_fffffffffffff720,
                   (io_context *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  }
  std::
  unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>,std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>>>
  ::
  unique_ptr<std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>>,void>
            ((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
              *)in_stack_fffffffffffff720,
             (pointer)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  std::
  unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
  ::operator=((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
               *)in_stack_fffffffffffff720,
              (unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  std::
  unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
  ::~unique_ptr((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                 *)in_stack_fffffffffffff730);
  bVar4 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                      *)0x10d0b1);
  if (((!bVar4) ||
      (bVar4 = std::unique_ptr::operator_cast_to_bool
                         ((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                           *)0x10d0cb), !bVar4)) ||
     (bVar4 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                          *)0x10d0e5), !bVar4)) {
    local_454[0] = Mau_OOM;
    goto LAB_0010d948;
  }
  postNextTimer(in_stack_fffffffffffff740);
  bVar4 = DeliveryChannel::Initialize(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
  if (!bVar4) {
    local_454[0] = Mau_OOM;
    goto LAB_0010d948;
  }
  bVar4 = DeliveryChannel::Initialize(in_stack_fffffffffffff788,in_stack_fffffffffffff780);
  if (!bVar4) {
    local_454[0] = Mau_OOM;
    goto LAB_0010d948;
  }
  local_668 = (int)asio::ip::udp::v4();
  asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
            ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffff730,
             (udp *)in_stack_fffffffffffff728,
             (unsigned_short)((ulong)in_stack_fffffffffffff720 >> 0x30));
  std::error_code::error_code((error_code *)in_stack_fffffffffffff720);
  pbVar8 = &std::
            unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
            ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                          *)0x10d203)->
            super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>;
  local_67c = (int)asio::ip::basic_endpoint<asio::ip::udp>::protocol
                             ((basic_endpoint<asio::ip::udp> *)
                              CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  __len = asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::open
                    (pbVar8,(char *)&local_67c,(int)&local_678);
  in_stack_fffffffffffff810 = extraout_RDX;
  local_690 = __len;
  bVar4 = std::error_code::operator_cast_to_bool(&local_678);
  if (bVar4) {
    local_454[0] = Mau_NetworkFailed;
    goto LAB_0010d948;
  }
  pbVar8 = &std::
            unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
            ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                          *)0x10d2ba)->
            super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>;
  local_6a0 = asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::bind
                        (pbVar8,(int)local_664,(sockaddr *)&local_678,__len);
  bVar4 = std::error_code::operator_cast_to_bool(&local_678);
  if (bVar4) {
    local_454[0] = Mau_PortInUse;
    goto LAB_0010d948;
  }
  local_2f8 = in_RDI + 0x68;
  local_304 = *(int *)(in_RDI + 0x2d4);
  local_308 = *(int *)(in_RDI + 0x2d8);
  local_300 = "UDPSocket";
  std::error_code::error_code((error_code *)in_stack_fffffffffffff720);
  local_320 = "send_buffer_size";
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                *)0x10d3a0);
  asio::detail::socket_option::integer<1,_7>::integer(&local_324,local_304);
  eVar9 = asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
          set_option<asio::detail::socket_option::integer<1,7>>
                    ((basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)
                     in_stack_fffffffffffff730,(integer<1,_7> *)in_stack_fffffffffffff728,
                     (error_code *)in_stack_fffffffffffff720);
  local_330 = eVar9._M_cat;
  local_338 = eVar9._M_value;
  bVar4 = std::error_code::operator_cast_to_bool(&local_318);
  if (bVar4) {
LAB_0010d575:
    local_2ed = '\0';
  }
  else {
    local_320 = "receive_buffer_size";
    std::
    unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
    ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                  *)0x10d444);
    asio::detail::socket_option::integer<1,_8>::integer(&local_33c,local_308);
    eVar9 = asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
            set_option<asio::detail::socket_option::integer<1,8>>
                      ((basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *
                       )in_stack_fffffffffffff730,(integer<1,_8> *)in_stack_fffffffffffff728,
                       (error_code *)in_stack_fffffffffffff720);
    local_348 = eVar9._M_cat;
    local_350 = eVar9._M_value;
    bVar4 = std::error_code::operator_cast_to_bool(&local_318);
    if (bVar4) goto LAB_0010d575;
    local_320 = "reuse_address";
    std::
    unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
    ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                  *)0x10d4e8);
    asio::detail::socket_option::boolean<1,_2>::boolean(&local_354,true);
    eVar9 = asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
            set_option<asio::detail::socket_option::boolean<1,2>>
                      ((basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *
                       )in_stack_fffffffffffff730,(boolean<1,_2> *)in_stack_fffffffffffff728,
                       (error_code *)in_stack_fffffffffffff720);
    local_360 = eVar9._M_cat;
    local_368 = eVar9._M_value;
    bVar4 = std::error_code::operator_cast_to_bool(&local_318);
    if (bVar4) goto LAB_0010d575;
    local_2ed = '\x01';
  }
  if (local_2ed == '\0') {
    local_454[0] = Mau_PortInUse;
  }
  else {
    local_6b8 = workerLoop;
    local_6b0 = (WindowHeader *)0x0;
    local_2c8 = local_6a8;
    local_2d0 = &local_6b8;
    local_2d8 = local_6c0;
    pvVar7 = operator_new(8,(nothrow_t *)&std::nothrow);
    local_2d9 = 0;
    if (pvVar7 != (void *)0x0) {
      local_2d9 = 1;
      std::thread::thread<void(mau::ProxySession::*)(),mau::ProxySession*,void>
                ((thread *)in_stack_fffffffffffff760,(type *)in_stack_fffffffffffff758,
                 in_stack_fffffffffffff750);
    }
    std::unique_ptr<std::thread,std::default_delete<std::thread>>::
    unique_ptr<std::default_delete<std::thread>,void>
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               in_stack_fffffffffffff720,
               (pointer)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               in_stack_fffffffffffff720,
               (unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)
               in_stack_fffffffffffff730);
    bVar4 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x10d70d);
    if (bVar4) {
      local_3e0 = in_RDI + 0x70;
      local_3e4 = *(int *)(in_RDI + 0x2e0) + 0x1c;
      Locker::Locker((Locker *)in_stack_fffffffffffff720,
                     (Lock *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
      this_00 = (ProxySession *)
                pktalloc::Allocator::Allocate
                          (in_stack_fffffffffffff760,
                           (uint)((ulong)in_stack_fffffffffffff758 >> 0x20));
      Locker::~Locker((Locker *)0x10d7dc);
      local_6c8 = this_00;
      if (this_00 == (ProxySession *)0x0) {
        local_454[0] = Mau_OOM;
      }
      else {
        postNextRead(this_00,in_stack_fffffffffffff768);
        if ((Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
             ::kAnyProtocolStr_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                                         ::kAnyProtocolStr_abi_cxx11_), iVar5 != 0)) {
          paVar11 = &local_6c9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)
                     Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                     ::kAnyProtocolStr_abi_cxx11_,"",paVar11);
          std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
          __cxa_atexit(std::__cxx11::string::~string,
                       Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                       ::kAnyProtocolStr_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)
                               ::kAnyProtocolStr_abi_cxx11_);
        }
        std::
        unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
        ::operator->((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                      *)0x10d8b3);
        in_stack_fffffffffffff760 = (Allocator *)local_6f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_6f1 + 1),(char *)local_438,
                   (allocator *)in_stack_fffffffffffff760);
        asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>::
        async_resolve<mau::ProxySession::Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)::__0>
                  ((basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_> *)
                   in_stack_fffffffffffff730,(string *)in_stack_fffffffffffff728,
                   (string *)in_stack_fffffffffffff720,
                   (anon_class_8_1_8991fb9c *)
                   CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
        std::__cxx11::string::~string((string *)(local_6f1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_6f1);
        in_stack_fffffffffffff758 = local_438;
      }
    }
    else {
      local_454[0] = Mau_OOM;
    }
  }
LAB_0010d948:
  std::__cxx11::ostringstream::~ostringstream(local_5e0);
  std::atomic<MauResult_t>::operator=
            ((atomic<MauResult_t> *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
  if (local_454[0] != Mau_Success) {
    local_2b8 = "ProxySession::Initialize failed: ";
    local_2c0 = local_454;
    local_294 = 4;
    local_2a0 = "ProxySession::Initialize failed: ";
    local_284 = 4;
    local_2a8 = local_2c0;
    if (*(int *)(in_RDI + 8) < 5) {
      local_cc = 4;
      local_d8 = "ProxySession::Initialize failed: ";
      puVar10 = local_268;
      local_e0 = local_2c0;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff720,
                 (char *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718),Trace);
      local_b0 = (string *)(in_RDI + 0x38);
      local_b8 = local_d8;
      local_c0 = local_e0;
      local_a8 = puVar10;
      local_98 = local_b0;
      local_90 = puVar10;
      local_80 = local_b0;
      local_78 = puVar10;
      std::operator<<((ostream *)(puVar10 + 0x10),local_b0);
      local_60 = local_a8;
      local_68 = local_b8;
      local_70 = local_c0;
      local_48 = local_a8;
      local_50 = local_b8;
      local_18 = local_a8;
      local_20 = local_b8;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_30 = local_60;
      local_38 = local_70;
      local_8 = local_60;
      local_10 = local_70;
      std::ostream::operator<<((ostream *)(local_60 + 0x10),*local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10dd82);
    }
    Shutdown(in_stack_fffffffffffff810);
  }
  return local_454[0];
}

Assistant:

MauResult ProxySession::Initialize(
    const char* serverHostname,
    uint16_t serverPort,
    const MauProxyConfig& proxyConfig,
    const MauChannelConfig& channelConfig)
{
    MauResult result = Mau_Success;

    try
    {
        ProxyConfig = proxyConfig;
        ChannelConfig.Set(channelConfig);
        ServerHostname = serverHostname;
        ServerPort = serverPort;

        // Set logger prefix
        std::ostringstream oss;
        oss << "[Port " << std::to_string(proxyConfig.UDPListenPort) << "] ";
        Logger.SetPrefix(oss.str());

        Context = MakeSharedNoThrow<asio::io_context>();
        if (!Context)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }
        Context->restart();

        // Create Asio objects
        Ticker = MakeUniqueNoThrow<asio::steady_timer>(*Context);
        Socket = MakeUniqueNoThrow<asio::ip::udp::socket>(*Context);
        Resolver = MakeUniqueNoThrow<asio::ip::tcp::resolver>(*Context);
        if (!Socket || !Resolver || !Ticker)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        postNextTimer();

        // Initialize S2C channel
        if (!S2C.Initialize(this))
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        // Initialize C2S channel
        if (!C2S.Initialize(this))
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        // Create an IPv4/IPv6 socket based on the server address type
        const UDPAddress bindAddress(asio::ip::udp::v4(), ProxyConfig.UDPListenPort);

        asio::error_code error;
        Socket->open(bindAddress.protocol(), error);
        if (error)
        {
            result = Mau_NetworkFailed;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        Socket->bind(bindAddress, error);
        if (error)
        {
            result = Mau_PortInUse;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        if (!SetSocketOptions(
            Socket,
            "UDPSocket",
            ProxyConfig.UDPSendBufferSizeBytes,
            ProxyConfig.UDPRecvBufferSizeBytes))
        {
            result = Mau_SocketCreation;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        Thread = MakeUniqueNoThrow<std::thread>(&ProxySession::workerLoop, this);
        if (!Thread)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        uint8_t* readBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);
        if (!readBuffer)
        {
            result = Mau_OOM;
            MAU_DEBUG_BREAK();
            goto OnError;
        }

        postNextRead(readBuffer);

        // Allow any protocol
        static const std::string kAnyProtocolStr = "";

        Resolver->async_resolve(std::string(serverHostname), kAnyProtocolStr,
            [this](const asio::error_code& error, const asio::ip::tcp::resolver::results_type& results)
        {
            asio::ip::address addr = firstIPv4AddressInResults(results);

            if (addr.is_unspecified())
            {
                Logger.Error("Unable to resolve server hostname: ", ServerHostname);
                LastResult = Mau_HostnameLookup;
            }
            else
            {
                const UDPAddress serverAddress(addr, ServerPort);
                ServerAddress.Set(serverAddress);
                C2S.SetDeliveryAddress(serverAddress);

                Logger.Info("Resolved server address to ", serverAddress.address().to_string(), " : ", serverAddress.port());
            }
        });
    }
    catch (...)
    {
        result = Mau_Error;
        goto OnError;
    }

OnError:
    LastResult = result;
    if (MAU_FAILED(result))
    {
        Logger.Error("ProxySession::Initialize failed: ", result);
        Shutdown();
    }

    return result;
}